

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void rw::wdgl::skinUninstanceCB(Geometry *geo)

{
  AttribDesc *a;
  Skin *this;
  InstanceDataHeader *pIVar1;
  float *__src;
  long lVar2;
  undefined1 auVar3 [16];
  int32 i;
  int iVar4;
  long lVar5;
  long lVar6;
  int32 i_1;
  uint8 *src;
  uint8 *puVar7;
  undefined1 (*dst) [16];
  undefined1 auVar8 [16];
  float fVar9;
  
  this = *(Skin **)((long)geo->texCoords + (long)skinGlobals + -0x38);
  if (this == (Skin *)0x0) {
    return;
  }
  pIVar1 = geo->instData;
  puVar7 = this->data;
  __src = this->inverseMatrices;
  Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
  memcpy(this->inverseMatrices,__src,(long)this->numBones << 6);
  (*DAT_00143840)(puVar7);
  puVar7 = this->indices;
  dst = (undefined1 (*) [16])this->weights;
  for (lVar6 = 0; lVar6 < (int)pIVar1[1].platform; lVar6 = lVar6 + 1) {
    lVar2 = *(long *)(pIVar1 + 2);
    lVar5 = lVar6 * 0x18;
    a = (AttribDesc *)(lVar2 + lVar5);
    src = (uint8 *)((ulong)*(uint *)(lVar2 + 0x14 + lVar5) + *(long *)(pIVar1 + 6));
    if (*(int *)(lVar2 + lVar5) == 4) {
      for (iVar4 = 0; iVar4 < geo->numVertices; iVar4 = iVar4 + 1) {
        unpackattrib((float *)dst,src,a,1.0);
        auVar8 = *dst;
        fVar9 = auVar8._12_4_ + auVar8._8_4_ + auVar8._4_4_ + auVar8._0_4_;
        if ((fVar9 != 0.0) || (NAN(fVar9))) {
          auVar3._4_4_ = fVar9;
          auVar3._0_4_ = fVar9;
          auVar3._8_4_ = fVar9;
          auVar3._12_4_ = fVar9;
          auVar8 = divps(auVar8,auVar3);
          *dst = auVar8;
        }
        dst = dst + 1;
        src = src + a->stride;
      }
    }
    else if (*(int *)(lVar2 + lVar5) == 5) {
      for (iVar4 = 0; iVar4 < geo->numVertices; iVar4 = iVar4 + 1) {
        *puVar7 = *src;
        puVar7[1] = src[1];
        puVar7[2] = src[2];
        puVar7[3] = src[3];
        puVar7 = puVar7 + 4;
        src = src + a->stride;
      }
    }
  }
  Skin::findNumWeights(this,geo->numVertices);
  Skin::findUsedBones(this,geo->numVertices);
  return;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_WDGL)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	// TODO: delete ibo and vbo
	rwFree(header->attribs);
	rwFree(header->data);
	rwFree(header);
	return object;
}